

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::testGroupEnded(ConsoleReporter *this,TestGroupStats *_testGroupStats)

{
  ostream *poVar1;
  TestGroupStats *_testGroupStats_local;
  ConsoleReporter *this_local;
  
  if (((this->super_StreamingReporterBase).currentGroupInfo.used & 1U) != 0) {
    printSummaryDivider(this);
    poVar1 = std::operator<<((this->super_StreamingReporterBase).stream,"Summary for group \'");
    poVar1 = std::operator<<(poVar1,(string *)&_testGroupStats->groupInfo);
    std::operator<<(poVar1,"\':\n");
    printTotals(this,&_testGroupStats->totals);
    poVar1 = std::operator<<((this->super_StreamingReporterBase).stream,"\n");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  StreamingReporterBase::testGroupEnded(&this->super_StreamingReporterBase,_testGroupStats);
  return;
}

Assistant:

virtual void testGroupEnded( TestGroupStats const& _testGroupStats ) {
            if( currentGroupInfo.used ) {
                printSummaryDivider();
                stream << "Summary for group '" << _testGroupStats.groupInfo.name << "':\n";
                printTotals( _testGroupStats.totals );
                stream << "\n" << std::endl;
            }
            StreamingReporterBase::testGroupEnded( _testGroupStats );
        }